

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseConversion.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
OpenMD::toUpperCopy<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,OpenMD *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cont,
          locale *param_2)

{
  locale alStack_18 [8];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  std::locale::locale(alStack_18);
  toUpper<std::__cxx11::string>(__return_storage_ptr__,alStack_18);
  std::locale::~locale(alStack_18);
  return __return_storage_ptr__;
}

Assistant:

Container toUpperCopy(const Container& cont,
                        const std::locale& = std::locale()) {
    Container result {cont};
    toUpper(result);

    return result;
  }